

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spp.cpp
# Opt level: O2

int __thiscall
SPP::solveSPV(SPP *this,Satellite **GPSPosAndVel,Satellite **BDSPosAndVel,Obs **GPSObs,Obs **BDSObs,
             Ephemeris **GPSEph,Ephemeris **BDSEph,ELLIPSOID type)

{
  XYZ *pXVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  Satellite *pSVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  XYZ a;
  XYZ a_00;
  double *pdVar15;
  double *pdVar16;
  long lVar17;
  int i;
  int row;
  void *pvVar18;
  void *__src;
  int iVar19;
  Matrix<double,__1,__1> *this_00;
  ulong uVar20;
  long lVar21;
  int iVar22;
  MatrixXd B;
  MatrixXd w;
  MatrixXd P;
  MatrixXd v;
  XYZ RefV;
  int flag;
  Matrix<double,_3,_1> local_148;
  MatrixXd tmp5;
  MatrixXd tmp4;
  MatrixXd tmp3;
  MatrixXd tmp2;
  MatrixXd tmp1;
  MatrixXd B_T;
  MatrixXd tmp10;
  MatrixXd tmp9;
  MatrixXd tmp8;
  MatrixXd tmp7;
  MatrixXd tmp6;
  
  pdVar16 = &(*GPSPosAndVel)->n;
  iVar22 = 0;
  for (lVar17 = 0x40; lVar17 != 0xe40; lVar17 = lVar17 + 0x70) {
    if (((*pdVar16 != -1.0) || (NAN(*pdVar16))) &&
       ((fVar2 = *(float *)((long)(*GPSObs)->psr + lVar17 + -0x10), fVar2 != -1.0 || (NAN(fVar2)))))
    {
      iVar22 = iVar22 + 1;
    }
    pdVar16 = pdVar16 + 0x17;
  }
  pdVar16 = &(*BDSPosAndVel)->n;
  iVar19 = 0;
  for (lVar17 = 0x40; lVar17 != 0x1c40; lVar17 = lVar17 + 0x70) {
    if (((*pdVar16 != -1.0) || (NAN(*pdVar16))) &&
       ((fVar2 = *(float *)((long)(*BDSObs)->psr + lVar17 + -0x10), fVar2 != -1.0 || (NAN(fVar2)))))
    {
      iVar19 = iVar19 + 1;
    }
    pdVar16 = pdVar16 + 0x17;
  }
  dVar3 = (this->result).UserPositionXYZ.Z;
  if ((dVar3 != -1.0) || (NAN(dVar3))) {
    pXVar1 = &(this->result).UserPositionXYZ;
    dVar4 = (this->result).UserPositionXYZ.X;
    dVar5 = (this->result).UserPositionXYZ.Y;
    Matrix<double,_-1,_-1>::Matrix(&B,iVar19 + iVar22,4);
    Matrix<double,_-1,_-1>::Matrix(&P,B.rows,B.rows);
    Matrix<double,_-1,_-1>::Matrix(&w,B.rows,1);
    XYZ::XYZ(&RefV,0.0,0.0,0.0);
    Matrix<double,_-1,_-1>::Zero(&B);
    Matrix<double,_-1,_-1>::Zero(&P);
    pdVar16 = (double *)&(this->result).field_0x680;
    lVar21 = 0;
    lVar17 = 0x40;
    uVar20 = 0;
    row = 0;
    while ((uVar20 < 0x20 && (iVar22 != 0))) {
      pSVar10 = *GPSPosAndVel;
      dVar6 = *(double *)((long)&pSVar10->n + lVar21);
      if (((dVar6 != -1.0) || (NAN(dVar6))) &&
         ((fVar2 = *(float *)((long)(*GPSObs)->psr + lVar17 + -0x10), fVar2 != -1.0 || (NAN(fVar2)))
         )) {
        dVar6 = *(double *)((long)&(pSVar10->SatVelocity).X + lVar21);
        dVar7 = *(double *)((long)&(pSVar10->SatVelocity).Y + lVar21);
        dVar8 = *(double *)((long)&(pSVar10->SatVelocity).Z + lVar21);
        dVar9 = *pdVar16;
        dVar13 = *(double *)*(undefined1 (*) [16])(pdVar16 + -2);
        dVar14 = pdVar16[-1];
        a.Z = dVar9;
        a._0_16_ = *(undefined1 (*) [16])(pdVar16 + -2);
        dVar12 = dist(a,*pXVar1);
        dVar13 = (dVar4 - dVar13) / dVar12;
        dVar14 = (dVar5 - dVar14) / dVar12;
        dVar12 = (dVar3 - dVar9) / dVar12;
        uVar11 = (ulong)DAT_0010f1e0;
        dVar9 = *(double *)((long)&(*GPSPosAndVel)->clkdot + lVar21);
        pdVar15 = Matrix<double,_-1,_-1>::operator()(&B,row,0);
        *pdVar15 = dVar13;
        pdVar15 = Matrix<double,_-1,_-1>::operator()(&B,row,1);
        *pdVar15 = dVar14;
        pdVar15 = Matrix<double,_-1,_-1>::operator()(&B,row,2);
        *pdVar15 = dVar12;
        pdVar15 = Matrix<double,_-1,_-1>::operator()(&B,row,3);
        *pdVar15 = 1.0;
        fVar2 = *(float *)((long)(*GPSObs)->psr + lVar17 + -0x10);
        pdVar15 = Matrix<double,_-1,_-1>::operator()(&w,row,0);
        *pdVar15 = (((double)fVar2 * 299792458.0) / -1575420000.0 -
                   (((double)((ulong)dVar13 ^ uVar11) * dVar6 - dVar7 * dVar14) - dVar8 * dVar12)) +
                   dVar9 * 299792458.0;
        pdVar15 = Matrix<double,_-1,_-1>::operator()(&P,row,row);
        *pdVar15 = 1.0;
        row = row + 1;
      }
      uVar20 = uVar20 + 1;
      pdVar16 = pdVar16 + 3;
      lVar21 = lVar21 + 0xb8;
      lVar17 = lVar17 + 0x70;
    }
    if (iVar19 != 0) {
      pdVar16 = (double *)&(this->result).field_0x80;
      lVar21 = 0;
      for (lVar17 = 0x40; lVar17 != 0x1c40; lVar17 = lVar17 + 0x70) {
        pSVar10 = *BDSPosAndVel;
        dVar6 = *(double *)((long)&pSVar10->n + lVar21);
        if (((dVar6 != -1.0) || (NAN(dVar6))) &&
           ((fVar2 = *(float *)((long)(*BDSObs)->psr + lVar17 + -0x10), fVar2 != -1.0 ||
            (NAN(fVar2))))) {
          dVar6 = *(double *)((long)&(pSVar10->SatVelocity).X + lVar21);
          dVar7 = *(double *)((long)&(pSVar10->SatVelocity).Y + lVar21);
          dVar8 = *(double *)((long)&(pSVar10->SatVelocity).Z + lVar21);
          dVar9 = *pdVar16;
          dVar13 = *(double *)*(undefined1 (*) [16])(pdVar16 + -2);
          dVar14 = pdVar16[-1];
          a_00.Z = dVar9;
          a_00._0_16_ = *(undefined1 (*) [16])(pdVar16 + -2);
          dVar12 = dist(a_00,*pXVar1);
          dVar13 = (dVar4 - dVar13) / dVar12;
          dVar14 = (dVar5 - dVar14) / dVar12;
          dVar12 = (dVar3 - dVar9) / dVar12;
          uVar20 = (ulong)DAT_0010f1e0;
          dVar9 = *(double *)((long)&(*BDSPosAndVel)->clkdot + lVar21);
          pdVar15 = Matrix<double,_-1,_-1>::operator()(&B,row,0);
          *pdVar15 = dVar13;
          pdVar15 = Matrix<double,_-1,_-1>::operator()(&B,row,1);
          *pdVar15 = dVar14;
          pdVar15 = Matrix<double,_-1,_-1>::operator()(&B,row,2);
          *pdVar15 = dVar12;
          pdVar15 = Matrix<double,_-1,_-1>::operator()(&B,row,3);
          *pdVar15 = 1.0;
          fVar2 = *(float *)((long)(*BDSObs)->psr + lVar17 + -0x10);
          pdVar15 = Matrix<double,_-1,_-1>::operator()(&w,row,0);
          *pdVar15 = (((double)fVar2 * 299792458.0) / -1561098000.0 -
                     (((double)((ulong)dVar13 ^ uVar20) * dVar6 - dVar7 * dVar14) - dVar8 * dVar12))
                     + dVar9 * 299792458.0;
          pdVar15 = Matrix<double,_-1,_-1>::operator()(&P,row,row);
          *pdVar15 = 1.0;
          row = row + 1;
        }
        pdVar16 = pdVar16 + 3;
        lVar21 = lVar21 + 0xb8;
      }
    }
    flag = 0;
    B_T = Matrix<double,_-1,_-1>::transpose(&B);
    tmp1 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&B_T,&P);
    tmp2 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&tmp1,&B);
    tmp3 = Matrix<double,_-1,_-1>::inverse(&tmp2,&flag);
    tmp4 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&tmp3,&B_T);
    tmp5 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&tmp4,&P);
    v = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&tmp5,&w);
    if (flag == 0) {
      pvVar18 = (void *)0x0;
      pdVar16 = Matrix<double,_-1,_-1>::operator()(&v,0,0);
      RefV.X = *pdVar16 + RefV.X;
      pdVar16 = Matrix<double,_-1,_-1>::operator()(&v,1,0);
      RefV.Y = *pdVar16 + RefV.Y;
      pdVar16 = Matrix<double,_-1,_-1>::operator()(&v,2,0);
      RefV.Z = *pdVar16 + RefV.Z;
      Matrix<double,_-1,_-1>::operator()(&v,3,0);
      tmp6 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&B,&v);
      tmp7 = Matrix<double,_-1,_-1>::operator-(&tmp6,&w);
      tmp8 = Matrix<double,_-1,_-1>::transpose(&tmp7);
      tmp9 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&tmp8,&P);
      tmp10 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&tmp9,&tmp7);
      __src = (void *)0x0;
      pdVar16 = Matrix<double,_-1,_-1>::operator()(&tmp10,0,0);
      dVar3 = *pdVar16 / (double)(iVar19 + iVar22 + -4);
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      (this->result).UserVelocitySigma = dVar3;
      Matrix<double,_-1,_-1>::deleteMatrix(&tmp6);
      Matrix<double,_-1,_-1>::deleteMatrix(&tmp7);
      Matrix<double,_-1,_-1>::deleteMatrix(&tmp8);
      Matrix<double,_-1,_-1>::deleteMatrix(&tmp9);
      Matrix<double,_-1,_-1>::deleteMatrix(&tmp10);
      local_148.rows = 3;
      local_148.cols = 1;
      local_148.data = (double *)operator_new__(0x18);
      iVar22 = 3;
      while (iVar19 = (int)pvVar18, iVar19 < iVar22) {
        pdVar16 = Matrix<double,_-1,_-1>::operator()(&v,iVar19,0);
        dVar3 = *pdVar16;
        __src = pvVar18;
        pdVar16 = Matrix<double,_3,_1>::operator()(&local_148,iVar19,0);
        *pdVar16 = dVar3;
        iVar22 = local_148.rows;
        pvVar18 = (void *)(ulong)(iVar19 + 1);
      }
      Matrix<double,_3,_1>::deleteMatrix(&local_148);
      Matrix<double,_-1,_-1>::deleteMatrix(&B_T);
      Matrix<double,_-1,_-1>::deleteMatrix(&tmp1);
      Matrix<double,_-1,_-1>::deleteMatrix(&tmp2);
      Matrix<double,_-1,_-1>::deleteMatrix(&tmp3);
      Matrix<double,_-1,_-1>::deleteMatrix(&tmp4);
      Matrix<double,_-1,_-1>::deleteMatrix(&tmp5);
      Matrix<double,_-1,_-1>::deleteMatrix(&v);
      (this->result).UserVelocity.Z = RefV.Z;
      (this->result).UserVelocity.X = RefV.X;
      (this->result).UserVelocity.Y = RefV.Y;
      Matrix<double,_-1,_-1>::deleteMatrix(&B);
      Matrix<double,_-1,_-1>::deleteMatrix(&P);
      this_00 = &w;
      Matrix<double,_-1,_-1>::deleteMatrix(this_00);
      memcpy(this_00,__src,0x12b8);
      return (int)this_00;
    }
    Matrix<double,_-1,_-1>::deleteMatrix(&B_T);
    Matrix<double,_-1,_-1>::deleteMatrix(&tmp1);
    Matrix<double,_-1,_-1>::deleteMatrix(&tmp2);
    Matrix<double,_-1,_-1>::deleteMatrix(&tmp3);
    Matrix<double,_-1,_-1>::deleteMatrix(&tmp4);
    Matrix<double,_-1,_-1>::deleteMatrix(&tmp5);
    Matrix<double,_-1,_-1>::deleteMatrix(&P);
    Matrix<double,_-1,_-1>::deleteMatrix(&w);
    Matrix<double,_-1,_-1>::deleteMatrix(&B);
    Matrix<double,_-1,_-1>::deleteMatrix(&v);
    iVar22 = 5;
  }
  else {
    iVar22 = 1;
  }
  return iVar22;
}

Assistant:

int SPP::solveSPV(Satellite* &&GPSPosAndVel, Satellite* &&BDSPosAndVel,
             Obs* &&GPSObs, Obs* &&BDSObs, Ephemeris* &&GPSEph,
             Ephemeris* &&BDSEph, ELLIPSOID type)
{
    int GPSObsNum = 0, BDSObsNum = 0;
    int cols = 4;
    for(int i = 0; i < MAXGPSSRN; ++i)
        if(GPSPosAndVel[i].n != -1 && GPSObs[i].dopp[0] != -1)
            GPSObsNum ++;
    for(int i = 0; i < MAXBDSSRN; ++i)
        if(BDSPosAndVel[i].n != -1 && BDSObs[i].dopp[0] != -1)
            BDSObsNum ++;
    // BDSObsNum = 0;
    XYZ RefPos = this->result.UserPositionXYZ;
    if(RefPos.Z == -1)
        return 1;
    // n * m
    MatrixXd B(BDSObsNum + GPSObsNum, cols);
    // n * n
    MatrixXd P(B.row(), B.row());
    // n * 1
    MatrixXd w(B.row(), 1);
    XYZ RefV(0, 0, 0);
    B.Zero();
    P.Zero();
    int count = 0;
    // cout << GPSObsNum << endl;
    double R = 0;
    int num = 0;
    for(int prn = 0; prn < MAXGPSSRN; ++prn)
    {
        if(GPSObsNum == 0)
            break;
        if(GPSPosAndVel[prn].n == -1 ||
            GPSObs[prn].dopp[0] == -1)
            continue;

        XYZ fix = GPSPosAndVel[prn].SatVelocity;
        // 在SPP时已经自转改正  故不需要再次改正
        XYZ SatPosi = this->result.GPSPosi[prn];
        XYZ pos = this->result.UserPositionXYZ;
        double rou = dist(SatPosi, pos);
        // double rou = this->result.GPSDist[prn];
        double l = (-SatPosi.X + RefPos.X) / rou; 
        double m = (-SatPosi.Y + RefPos.Y) / rou;
        double n = (-SatPosi.Z + RefPos.Z) / rou;

        double deltatdot = GPSPosAndVel[prn].clkdot;//GPSEph[prn].af1 + 2 * GPSEph[prn].af2 *
                            //(GPSPosAndVel[prn].t - GPSPosAndVel[prn].deltat - GPSEph[prn].toc);

        double roudot = -l * (fix.X) - m * (fix.Y) - n * (fix.Z);

        B(num, 0) = l;
        B(num, 1) = m;
        B(num, 2) = n;
        B(num, 3) = 1;
        w(num, 0) = -GPSObs[prn].dopp[0] * LIGHTSPEED / GPSL1 -
                    roudot + deltatdot * LIGHTSPEED - R;
        P(num, num) = 1;
        num ++;
    }
    for(int prn = 0; prn < MAXBDSSRN; ++prn)
    {
        if(BDSObsNum == 0)
            break;
        if(BDSPosAndVel[prn].n == -1 ||
            BDSObs[prn].dopp[0] == -1)
            continue;
        // 地球自转改正
        XYZ fix = BDSPosAndVel[prn].SatVelocity;
        // EarthRotationFix(BDSPosAndVel[prn].deltat, BDSPosAndVel[prn].SatVelocity, BDS, fix);
        // 在SPP时已经自转改正  故不需要再次改正
        XYZ SatPosi = this->result.BDSPosi[prn];
        XYZ pos = this->result.UserPositionXYZ;
        double rou = dist(SatPosi, pos);
        // double rou = this->result.BDSDist[prn];
        double l = (-SatPosi.X + RefPos.X) / rou; 
        double m = (-SatPosi.Y + RefPos.Y) / rou;
        double n = (-SatPosi.Z + RefPos.Z) / rou;

        double deltatdot = BDSPosAndVel[prn].clkdot;//BDSEph[prn].af1 + 2 * BDSEph[prn].af2 *
                            //(BDSPosAndVel[prn].t - BDSPosAndVel[prn].deltat - BDSEph[prn].toc);

        double roudot = -l * (fix.X) - m * (fix.Y) - n * (fix.Z);

        B(num, 0) = l;
        B(num, 1) = m;
        B(num, 2) = n;
        B(num, 3) = 1;
        w(num, 0) = -BDSObs[prn].dopp[0] * LIGHTSPEED / BDSB1 -
                    roudot + deltatdot * LIGHTSPEED - R;
        P(num, num) = 1;
        num ++;
    }
    int flag = 0;
    MatrixXd B_T = B.transpose();
    MatrixXd tmp1 = B_T * P;
    MatrixXd tmp2 = tmp1 * B;
    MatrixXd tmp3 = tmp2.inverse(flag);
    MatrixXd tmp4 = tmp3 * B_T;
    MatrixXd tmp5 = tmp4 * P;
    MatrixXd v = tmp5 * w;

    if(flag != 0){
        B_T.deleteMatrix();
        tmp1.deleteMatrix();
        tmp2.deleteMatrix();
        tmp3.deleteMatrix();
        tmp4.deleteMatrix();
        tmp5.deleteMatrix();
        P.deleteMatrix();
        w.deleteMatrix();
        B.deleteMatrix();
        v.deleteMatrix();
        return NOT_INVERTIBLE;
    }
    
    RefV.X += v(0, 0);
    RefV.Y += v(1, 0);
    RefV.Z += v(2, 0);
    R += v(3, 0);
    
    MatrixXd tmp6 = B * v;
    MatrixXd tmp7 = tmp6 - w;
    MatrixXd tmp8 = tmp7.transpose();
    MatrixXd tmp9 = tmp8 * P;
    MatrixXd tmp10 = tmp9 * tmp7;
    int Obsnum = 4;
    double sigma = sqrt(tmp10(0, 0) / (BDSObsNum + GPSObsNum - Obsnum));
    result.UserVelocitySigma = sigma;

    tmp6.deleteMatrix();
    tmp7.deleteMatrix();
    tmp8.deleteMatrix();
    tmp9.deleteMatrix();
    tmp10.deleteMatrix();

    Vector3d dx;
    for(int i = 0; i < dx.row(); i++)
        dx(i, 0) = v(i, 0);
    dx.deleteMatrix();
    B_T.deleteMatrix();
    tmp1.deleteMatrix();
    tmp2.deleteMatrix();
    tmp3.deleteMatrix();
    tmp4.deleteMatrix();
    tmp5.deleteMatrix();
    v.deleteMatrix();
    this->result.UserVelocity = RefV;
    B.deleteMatrix();
    P.deleteMatrix();
    w.deleteMatrix();
}